

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O3

void __thiscall adjMaxtrix<char>::~adjMaxtrix(adjMaxtrix<char> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  ulong uVar3;
  
  pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar2) {
    uVar3 = 0;
    do {
      if (this->edge[uVar3] != (int *)0x0) {
        operator_delete__(this->edge[uVar3]);
        pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pcVar1 - (long)pcVar2));
  }
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

adjMaxtrix<dataType>::~adjMaxtrix()
{
	//撤销矩阵
	for (int i = 0; i < vexs.size(); i++)
		delete[] edge[i];
}